

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_load_fpr32(DisasContext_conflict6 *ctx,TCGv_i32 t,int reg)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->hflags & 0x2000000) != 0) {
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,0x14);
    local_38 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
    local_30 = (TCGTemp *)(pTVar1 + (long)tcg_ctx_00);
    tcg_gen_callN_mips64el(tcg_ctx_00,helper_raise_exception_mips64el,(TCGTemp *)0x0,2,&local_38);
    tcg_temp_free_internal_mips64el(tcg_ctx_00,(TCGTemp *)(pTVar1 + (long)tcg_ctx_00));
  }
  tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,t,tcg_ctx_00->fpu_f64[reg]);
  return;
}

Assistant:

static void gen_load_fpr32(DisasContext *ctx, TCGv_i32 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_FRE) {
        generate_exception(ctx, EXCP_RI);
    }
    tcg_gen_extrl_i64_i32(tcg_ctx, t, tcg_ctx->fpu_f64[reg]);
}